

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_malloc.c
# Opt level: O2

int bucket_of_size(size_t size)

{
  long lVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 6) {
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/frame_malloc.c"
                    ,0x170,"0",in_R8,in_R9,6);
    }
    if (size <= __cilkrts_bucket_sizes[lVar1]) break;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

static int bucket_of_size(size_t size)
{
    int i;

    for (i = 0; i < FRAME_MALLOC_NBUCKETS; ++i)
        if (size <= FRAME_MALLOC_BUCKET_TO_SIZE(i))
            return i;

    CILK_ASSERT(0 /* can't happen */);
    return -1;
}